

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

Message * __thiscall
google::protobuf::Reflection::UnsafeArenaReleaseMessage
          (Reflection *this,Message *message,FieldDescriptor *field,MessageFactory *factory)

{
  FieldDescriptor FVar1;
  uint32_t uVar2;
  MessageLite *pMVar3;
  LogMessage *pLVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  LogFinisher local_a1;
  LogMessage local_a0;
  LogMessage local_68;
  
  if (*(Descriptor **)(field + 0x20) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage","Field does not match message type.");
  }
  if ((~(byte)field[1] & 0x60) == 0) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"ReleaseMessage",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_a0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_68._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)&local_a0,
               (FieldDescriptor **)&local_68);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)field[2] * 4) != 10) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"ReleaseMessage",CPPTYPE_MESSAGE);
  }
  FVar1 = field[1];
  if (((byte)FVar1 & 8) == 0) {
    if (((~(byte)FVar1 & 0x60) != 0) &&
       ((lVar8 = *(long *)(field + 0x28), lVar8 == 0 || ((byte)FVar1 & 0x10) == 0 ||
        ((*(int *)(lVar8 + 4) == 1 && ((*(byte *)(*(long *)(lVar8 + 0x20) + 1) & 2) != 0)))))) {
      ClearBit(this,message,field);
    }
    uVar7 = *(ulong *)(field + 0x28);
    if ((uVar7 != 0 && ((byte)field[1] & 0x10) != 0) &&
       ((*(int *)(uVar7 + 4) != 1 || ((*(byte *)(*(long *)(uVar7 + 0x20) + 1) & 2) == 0)))) {
      uVar6 = 0;
      if (((byte)field[1] & 0x10) == 0) {
        uVar7 = uVar6;
      }
      if (*(int *)(uVar7 + 4) == 1) {
        uVar6 = (ulong)((*(byte *)(*(long *)(uVar7 + 0x20) + 1) & 2) >> 1);
      }
      if ((char)uVar6 != '\0') {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/message.h"
                   ,0x5b7);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_68,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_a0,pLVar4);
        if ((char)uVar6 != '\0') {
          internal::LogMessage::~LogMessage(&local_68);
        }
      }
      if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                  (ulong)(uint)((int)(uVar7 - *(long *)(*(long *)(uVar7 + 0x10) + 0x30) >> 3) *
                                0x33333334 + (this->schema_).oneof_case_offset_)) !=
          *(int *)(field + 4)) {
        return (Message *)0x0;
      }
      bVar5 = 0;
      if (((byte)field[1] & 0x10) == 0) {
        lVar8 = 0;
      }
      else {
        lVar8 = *(long *)(field + 0x28);
      }
      if (*(int *)(lVar8 + 4) == 1) {
        bVar5 = (*(byte *)(*(long *)(lVar8 + 0x20) + 1) & 2) >> 1;
      }
      if (bVar5 != 0) {
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
                   ,0x97b);
        pLVar4 = internal::LogMessage::operator<<
                           (&local_a0,"CHECK failed: !oneof_descriptor->is_synthetic(): ");
        internal::LogFinisher::operator=(&local_a1,pLVar4);
        if (bVar5 != 0) {
          internal::LogMessage::~LogMessage(&local_a0);
        }
      }
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(lVar8 - *(long *)(*(long *)(lVar8 + 0x10) + 0x30)) >> 3) *
                     0x33333334 + (this->schema_).oneof_case_offset_)) = 0;
    }
    uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
    pMVar3 = *(MessageLite **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2)
    ;
    *(undefined8 *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2) = 0;
  }
  else {
    if (factory == (MessageFactory *)0x0) {
      factory = this->message_factory_;
    }
    uVar2 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    pMVar3 = internal::ExtensionSet::UnsafeArenaReleaseMessage
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),field
                        ,factory);
  }
  return (Message *)pMVar3;
}

Assistant:

Message* Reflection::UnsafeArenaReleaseMessage(Message* message,
                                               const FieldDescriptor* field,
                                               MessageFactory* factory) const {
  USAGE_CHECK_ALL(ReleaseMessage, SINGULAR, MESSAGE);
  CheckInvalidAccess(schema_, field);

  if (factory == nullptr) factory = message_factory_;

  if (field->is_extension()) {
    return static_cast<Message*>(
        MutableExtensionSet(message)->UnsafeArenaReleaseMessage(field,
                                                                factory));
  } else {
    if (!(field->is_repeated() || schema_.InRealOneof(field))) {
      ClearBit(message, field);
    }
    if (schema_.InRealOneof(field)) {
      if (HasOneofField(*message, field)) {
        *MutableOneofCase(message, field->containing_oneof()) = 0;
      } else {
        return nullptr;
      }
    }
    Message** result = MutableRaw<Message*>(message, field);
    Message* ret = *result;
    *result = nullptr;
    return ret;
  }
}